

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O1

void test_cpp_add_range_closed_combinatoric_64(void **param_1)

{
  uint64_t uVar1;
  uint32_t bit_index;
  long lVar2;
  uint uVar3;
  Roaring64Map roaring;
  Roaring64Map local_68;
  
  uVar3 = 0;
  do {
    local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68.roarings._M_t._M_impl._0_8_ = 0;
    local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
    local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_68.copyOnWrite = false;
    uVar1 = 0x3200000000;
    lVar2 = 0;
    local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if ((uVar3 >> ((uint)lVar2 & 0x1f) & 1) != 0) {
        ::roaring::Roaring64Map::add(&local_68,uVar1);
      }
      lVar2 = lVar2 + 1;
      uVar1 = uVar1 + 0x100000001;
    } while (lVar2 != 5);
    ::roaring::Roaring64Map::addRangeClosed(&local_68,0x3200000000,0x36ffffffff);
    uVar1 = ::roaring::Roaring64Map::cardinality(&local_68);
    _assert_int_equal(0x500000000,uVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
                      ,0x428);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                 *)&local_68);
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x20);
  return;
}

Assistant:

DEFINE_TEST(test_cpp_add_range_closed_combinatoric_64) {
    // Given 'num_slots_to_test' outer slots, we repeatedly seed a Roaring64Map
    // with all combinations of present and absent outer slots (basically the
    // powerset of {0...num_slots_to_test - 1}), then we add_range_closed
    // and see if the cardinality is what we expect.
    //
    // For example (assuming num_slots_to_test = 5), the iterations of the outer
    // loop represent these sets:
    // 1. {}
    // 2. {0}
    // 3. {1}
    // 4. {0, 1}
    // 5. {2}
    // 6. {0, 2}
    // 7. {1, 2}
    // 8. {0, 1, 2}
    // 9. {3}
    // and so forth...
    //
    // For example, in step 6 (representing set {0, 2}) we set a bit somewhere
    // in slot 0 and we set another bit somehwere in slot 2. The purpose of this
    // is to make sure 'addRangeClosed' does the right thing when it encounters
    // an arbitrary mix of present and absent slots. Then we call
    // 'addRangeClosed' over the whole range and confirm that the cardinality
    // is what we expect.
    const uint32_t num_slots_to_test = 5;
    const uint32_t base_slot = 50;

    const uint32_t bitmask_limit = 1 << num_slots_to_test;

    for (uint32_t bitmask = 0; bitmask < bitmask_limit; ++bitmask) {
        Roaring64Map roaring;

        // The 1-bits in 'bitmask' indicate which slots we want to seed
        // with a value.
        for (uint32_t bit_index = 0; bit_index < num_slots_to_test;
             ++bit_index) {
            if ((bitmask & (1 << bit_index)) == 0) {
                continue;
            }
            auto slot = base_slot + bit_index;
            auto value = (uint64_t(slot) << 32) + bit_index;
            roaring.add(value);
        }

        auto first_bucket = uint64_t(base_slot) << 32;
        auto last_bucket = uint64_t(base_slot + num_slots_to_test - 1) << 32;

        roaring.addRangeClosed(first_bucket, last_bucket + uint32_max);

        auto expected_cardinality = num_slots_to_test * (uint64_t(1) << 32);
        assert_int_equal(expected_cardinality, roaring.cardinality());
    }
}